

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::FlushStateToDisk
          (Chainstate *this,BlockValidationState *state,FlushStateMode mode,int nManualPruneHeight)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *pbVar2;
  long lVar3;
  CoinsViews *pCVar4;
  BlockTreeDB *this_00;
  ChainstateManager *pCVar5;
  Notifications *pNVar6;
  ValidationSignals *this_01;
  string prefix;
  string prefix_00;
  string prefix_01;
  string prefix_02;
  string prefix_03;
  string prefix_04;
  string end_msg;
  string end_msg_00;
  string end_msg_01;
  string end_msg_02;
  string end_msg_03;
  string end_msg_04;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint uVar10;
  CoinsCacheSizeState CVar11;
  int iVar12;
  ChainstateRole role;
  CCoinsViewCache *pCVar13;
  size_t sVar14;
  Logger *pLVar15;
  undefined8 extraout_RAX;
  long lVar16;
  undefined8 extraout_RAX_00;
  undefined8 uVar17;
  uchar *puVar18;
  size_t max_mempool_size_bytes;
  byte bVar19;
  ChainstateManager *in_R8;
  byte bVar20;
  byte bVar21;
  _Hash_node_base *p_Var22;
  long in_FS_OFFSET;
  bool bVar23;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  char in_stack_fffffffffffffd2f;
  FlushStateMode FVar24;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 uVar25;
  size_t coins_count;
  int last_prune;
  undefined4 uStack_2ac;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  limiting_lock;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer13;
  set<int,_std::less<int>,_std::allocator<int>_> setFilesToPrune;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock11.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock11.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock11.super_unique_lock);
  pCVar4 = (this->m_coins_views)._M_t.
           super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
           super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
           super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  if ((pCVar4 == (CoinsViews *)0x0) ||
     ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
      *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
       &(pCVar4->m_cacheview)._M_t.
        super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
      (CCoinsViewCache *)0x0)) {
    __assert_fail("this->CanFlushToDisk()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xadf,
                  "bool Chainstate::FlushStateToDisk(BlockValidationState &, FlushStateMode, int)");
  }
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar13 = CoinsTip(this);
  uVar10 = CCoinsViewCache::GetCacheSize(pCVar13);
  coins_count = (size_t)uVar10;
  pCVar13 = CoinsTip(this);
  sVar14 = CCoinsViewCache::DynamicMemoryUsage(pCVar13);
  if (this->m_mempool == (CTxMemPool *)0x0) {
    max_mempool_size_bytes = 0;
  }
  else {
    max_mempool_size_bytes = (this->m_mempool->m_opts).max_size_bytes;
  }
  CVar11 = GetCoinsCacheSizeState(this,this->m_coinstip_cache_size_bytes,max_mempool_size_bytes);
  criticalblock12.super_unique_lock._M_device = (mutex_type *)this->m_blockman;
  criticalblock12.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock12.super_unique_lock);
  if ((this->m_blockman->m_prune_mode == true) &&
     (((0 < nManualPruneHeight || (this->m_blockman->m_check_for_pruning != false)) &&
      (((this->m_chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)))) {
    last_prune = (int)((ulong)((long)(this->m_chain).vChain.
                                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_chain).vChain.
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    limiting_lock.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._32_8_ = limiting_lock.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._32_8_ & 0xffffffffffffff00;
    p_Var22 = (this->m_blockman->m_prune_locks)._M_h._M_before_begin._M_nxt;
    if (p_Var22 != (_Hash_node_base *)0x0) {
      do {
        if (*(int *)&p_Var22[5]._M_nxt != 0x7fffffff) {
          iVar12 = *(int *)&p_Var22[5]._M_nxt + -0xb;
          if (iVar12 < last_prune) {
            last_prune = iVar12;
          }
          if (last_prune < 2) {
            last_prune = 1;
          }
          if (last_prune == iVar12) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&limiting_lock,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var22 + 1));
          }
        }
        p_Var22 = p_Var22->_M_nxt;
      } while (p_Var22 != (_Hash_node_base *)0x0);
    }
    if (limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged != false) {
      pLVar15 = LogInstance();
      bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar15,PRUNE,Debug);
      if (bVar7) {
        if (limiting_lock.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00aeb42b;
        }
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "FlushStateToDisk";
        logging_function._M_len = 0x10;
        LogPrintFormatInternal<std::__cxx11::string,int>
                  (logging_function,source_file,0xafe,PRUNE,Debug,
                   (ConstevalFormatString<2U>)0xfd3dba,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &limiting_lock,&last_prune);
      }
    }
    if (nManualPruneHeight < 1) {
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"FlushStateToDisk","");
      local_148[0] = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"find files to prune","");
      prefix_02._M_string_length = in_stack_fffffffffffffd20;
      prefix_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      prefix_02.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
      prefix_02.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
      prefix_02.field_2._8_4_ = mode;
      prefix_02.field_2._12_4_ = in_stack_fffffffffffffd34;
      end_msg_02._M_string_length = sVar14;
      end_msg_02._M_dataplus._M_p = (pointer)state;
      end_msg_02.field_2._M_allocated_capacity = coins_count;
      end_msg_02.field_2._8_4_ = last_prune;
      end_msg_02.field_2._12_4_ = uStack_2ac;
      FVar24 = mode;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_02,end_msg_02,(LogFlags)local_128,SUB81(local_148,0));
      if (local_148[0] != local_138) {
        operator_delete(local_148[0],local_138[0] + 1);
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0],local_118[0] + 1);
      }
      in_R8 = this->m_chainman;
      ::node::BlockManager::FindFilesToPrune
                (this->m_blockman,&setFilesToPrune,last_prune,this,in_R8);
      this->m_blockman->m_check_for_pruning = false;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      uVar17 = extraout_RAX_00;
    }
    else {
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"FlushStateToDisk","");
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"find files to prune (manual)","");
      prefix._M_string_length = in_stack_fffffffffffffd20;
      prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      prefix.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
      prefix.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
      prefix.field_2._8_4_ = mode;
      prefix.field_2._12_4_ = in_stack_fffffffffffffd34;
      end_msg._M_string_length = sVar14;
      end_msg._M_dataplus._M_p = (pointer)state;
      end_msg.field_2._M_allocated_capacity = coins_count;
      end_msg.field_2._8_4_ = last_prune;
      end_msg.field_2._12_4_ = uStack_2ac;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix,end_msg,(LogFlags)local_e8,SUB81(local_108,0));
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0],local_f8[0] + 1);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0],local_d8[0] + 1);
      }
      if (last_prune < nManualPruneHeight) {
        nManualPruneHeight = last_prune;
      }
      in_R8 = this->m_chainman;
      ::node::BlockManager::FindFilesToPruneManual
                (this->m_blockman,&setFilesToPrune,nManualPruneHeight,this,in_R8);
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      uVar17 = extraout_RAX;
      FVar24 = mode;
    }
    uVar25 = (undefined4)
             CONCAT71((int7)((ulong)uVar17 >> 8),
                      setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
    if ((setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->m_blockman->m_have_pruned == false)) {
      this_00 = (this->m_blockman->m_block_tree_db)._M_t.
                super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                ._M_t.
                super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
      logging_timer13.m_start_t.
      super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_payload = (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
                     )&logging_timer13.m_prefix;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&logging_timer13,"prunedblockfiles","");
      kernel::BlockTreeDB::WriteFlag(this_00,(string *)&logging_timer13,true);
      if (logging_timer13.m_start_t.
          super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ._M_payload !=
          (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
           )&logging_timer13.m_prefix) {
        operator_delete((void *)logging_timer13.m_start_t.
                                super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                ._M_payload,(ulong)(logging_timer13.m_prefix._M_dataplus._M_p + 1));
      }
      this->m_blockman->m_have_pruned = true;
    }
    if ((limiting_lock.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_ = limiting_lock.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_ & 0xffffffffffffff00,
       limiting_lock.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       (pointer)((long)&limiting_lock.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10))) {
      operator_delete((void *)limiting_lock.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      limiting_lock.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  else {
    uVar25 = 0;
    FVar24 = mode;
  }
  lVar16 = std::chrono::_V2::steady_clock::now();
  if ((this->m_last_write).__d.__r == 0) {
    (this->m_last_write).__d.__r = lVar16;
  }
  if ((this->m_last_flush).__d.__r == 0) {
    (this->m_last_flush).__d.__r = lVar16;
  }
  bVar7 = mode == PERIODIC;
  bVar23 = mode == IF_NEEDED;
  bVar19 = 1;
  if ((mode != ALWAYS && (CVar11 == OK || !bVar7)) && (LARGE >= CVar11 || !bVar23)) {
    bVar19 = ((this->m_last_flush).__d.__r + 86400000000000 < lVar16 && mode == PERIODIC) |
             (byte)uVar25;
  }
  if ((((this->m_last_write).__d.__r + 3600000000000 < lVar16 && bVar7) | bVar19) == 1) {
    bVar8 = CheckDiskSpace(&(this->m_blockman->m_opts).blocks_dir,0);
    if (bVar8) {
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"FlushStateToDisk","");
      local_188[0] = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"write block and undo data to disk","");
      prefix_00._M_string_length = lVar16;
      prefix_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      prefix_00.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
      prefix_00.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
      prefix_00.field_2._8_4_ = FVar24;
      prefix_00.field_2._12_4_ = uVar25;
      end_msg_00._M_string_length = sVar14;
      end_msg_00._M_dataplus._M_p = (pointer)state;
      end_msg_00.field_2._M_allocated_capacity = coins_count;
      end_msg_00.field_2._8_4_ = last_prune;
      end_msg_00.field_2._12_4_ = uStack_2ac;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_00,end_msg_00,(LogFlags)local_168,SUB81(local_188,0));
      mode = FVar24;
      if (local_188[0] != local_178) {
        operator_delete(local_188[0],local_178[0] + 1);
        mode = FVar24;
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
      bVar8 = ::node::BlockManager::FlushChainstateBlockFile
                        (this->m_blockman,
                         (int)((ulong)((long)(this->m_chain).vChain.
                                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_chain).vChain.
                                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
      if (!bVar8) {
        pLVar15 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar15,VALIDATION,Warning);
        if (bVar8) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x5e;
          logging_function_00._M_str = "FlushStateToDisk";
          logging_function_00._M_len = 0x10;
          LogPrintFormatInternal<char[17]>
                    (logging_function_00,source_file_00,0xb35,VALIDATION,Warning,
                     (ConstevalFormatString<1U>)0xfd3e2e,(char (*) [17])0xfd3f1a);
        }
      }
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      local_1a8[0] = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"FlushStateToDisk","");
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"write block index to disk","");
      in_R8 = (ChainstateManager *)0x1;
      prefix_01._M_string_length = lVar16;
      prefix_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      prefix_01.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
      prefix_01.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
      prefix_01.field_2._8_4_ = mode;
      prefix_01.field_2._12_4_ = uVar25;
      end_msg_01._M_string_length = sVar14;
      end_msg_01._M_dataplus._M_p = (pointer)state;
      end_msg_01.field_2._M_allocated_capacity = coins_count;
      end_msg_01.field_2._8_4_ = last_prune;
      end_msg_01.field_2._12_4_ = uStack_2ac;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_01,end_msg_01,(LogFlags)local_1a8,SUB81(local_1c8,0));
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],local_198[0] + 1);
      }
      cVar9 = ::node::BlockManager::WriteBlockIndexDB(this->m_blockman);
      if ((bool)cVar9) {
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13)
        ;
LAB_00aea8b1:
        FVar24 = mode;
        if ((char)uVar25 != '\0') {
          local_228[0] = local_218;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"FlushStateToDisk","")
          ;
          local_248[0] = local_238;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"unlink pruned files","");
          in_R8 = (ChainstateManager *)0x1;
          prefix_03._M_string_length = lVar16;
          prefix_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
          prefix_03.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
          prefix_03.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
          prefix_03.field_2._8_4_ = FVar24;
          prefix_03.field_2._12_4_ = uVar25;
          end_msg_03._M_string_length = sVar14;
          end_msg_03._M_dataplus._M_p = (pointer)state;
          end_msg_03.field_2._M_allocated_capacity = coins_count;
          end_msg_03.field_2._8_4_ = last_prune;
          end_msg_03.field_2._12_4_ = uStack_2ac;
          BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                    (&logging_timer13,prefix_03,end_msg_03,(LogFlags)local_228,SUB81(local_248,0));
          if (local_248[0] != local_238) {
            operator_delete(local_248[0],local_238[0] + 1);
          }
          if (local_228[0] != local_218) {
            operator_delete(local_228[0],local_218[0] + 1);
          }
          ::node::BlockManager::UnlinkPrunedFiles(this->m_blockman,&setFilesToPrune);
          BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
                    (&logging_timer13);
        }
        (this->m_last_write).__d.__r = lVar16;
        goto LAB_00aea9a3;
      }
      pNVar6 = (this->m_chainman->m_options).notifications;
      limiting_lock.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (_Alloc_hider)
           ((long)&limiting_lock.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&limiting_lock,"Failed to write to block index database.","");
      pbVar2 = &limiting_lock.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pbVar2,"Failed to write to block index database.","");
        in_stack_fffffffffffffd2f = cVar9;
      }
      else {
        last_prune = 0xfd3e69;
        uStack_2ac = 0;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&last_prune);
        in_stack_fffffffffffffd2f = cVar9;
      }
      (*pNVar6->_vptr_Notifications[8])(pNVar6,&limiting_lock);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &limiting_lock);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)limiting_lock.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_ != &local_1d8) {
        operator_delete((void *)limiting_lock.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._32_8_,local_1d8._M_allocated_capacity + 1);
      }
      if (limiting_lock.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          (pointer)((long)&limiting_lock.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10)) {
        operator_delete((void *)limiting_lock.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        limiting_lock.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      bVar21 = 1;
      bVar20 = 1;
      if (in_stack_fffffffffffffd2f != '\0') goto LAB_00aea8b1;
    }
    else {
      pNVar6 = (this->m_chainman->m_options).notifications;
      logging_timer13.m_start_t.
      super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_payload = (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
                     )&logging_timer13.m_prefix;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&logging_timer13,"Disk space is too low!","");
      paVar1 = &logging_timer13.m_prefix.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        logging_timer13.m_prefix.field_2._M_allocated_capacity = (size_type)&logging_timer13.m_title
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)paVar1,"Disk space is too low!","");
      }
      else {
        last_prune = 0xfa0b16;
        uStack_2ac = 0;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar1,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&last_prune);
      }
      (*pNVar6->_vptr_Notifications[8])(pNVar6,&logging_timer13);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &logging_timer13);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((string *)logging_timer13.m_prefix.field_2._M_allocated_capacity !=
          &logging_timer13.m_title) {
        operator_delete((void *)logging_timer13.m_prefix.field_2._M_allocated_capacity,
                        (ulong)(logging_timer13.m_title._M_dataplus._M_p + 1));
      }
      if (logging_timer13.m_start_t.
          super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ._M_payload !=
          (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
           )&logging_timer13.m_prefix) {
        operator_delete((void *)logging_timer13.m_start_t.
                                super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                ._M_payload,(ulong)(logging_timer13.m_prefix._M_dataplus._M_p + 1));
      }
      bVar21 = 1;
LAB_00aeab05:
      bVar20 = 1;
    }
  }
  else {
LAB_00aea9a3:
    if (bVar19 == 0) {
      bVar20 = 1;
      bVar21 = 0;
    }
    else {
      pCVar13 = CoinsTip(this);
      (*(pCVar13->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])
                (&logging_timer13,pCVar13);
      paVar1 = &logging_timer13.m_prefix.field_2;
      puVar18 = std::
                __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                          (&logging_timer13,paVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18 == paVar1) {
        bVar21 = 0;
        goto LAB_00aeab05;
      }
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"FlushStateToDisk","");
      limiting_lock.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(sVar14 / 1000);
      tinyformat::format<unsigned_long,unsigned_long>
                (&local_288,(tinyformat *)"write coins cache to disk (%d coins, %.2fkB)",
                 (char *)&coins_count,(unsigned_long *)&limiting_lock,(unsigned_long *)in_R8);
      prefix_04._M_string_length = lVar16;
      prefix_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
      prefix_04.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffd28;
      prefix_04.field_2._M_local_buf[7] = in_stack_fffffffffffffd2f;
      prefix_04.field_2._8_4_ = FVar24;
      prefix_04.field_2._12_4_ = uVar25;
      end_msg_04._M_string_length = sVar14;
      end_msg_04._M_dataplus._M_p = (pointer)state;
      end_msg_04.field_2._M_allocated_capacity = coins_count;
      end_msg_04.field_2._8_4_ = last_prune;
      end_msg_04.field_2._12_4_ = uStack_2ac;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_04,end_msg_04,(LogFlags)local_268,SUB81(&local_288,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      pCVar5 = this->m_chainman;
      pCVar13 = CoinsTip(this);
      uVar10 = CCoinsViewCache::GetCacheSize(pCVar13);
      bVar8 = CheckDiskSpace(&(pCVar5->m_options).datadir,(ulong)(uVar10 * 0xc0));
      if (bVar8) {
        if ((mode == ALWAYS) || (CVar11 != OK && bVar7 || LARGE < CVar11 && bVar23)) {
          pCVar13 = CoinsTip(this);
          bVar7 = CCoinsViewCache::Flush(pCVar13);
        }
        else {
          pCVar13 = CoinsTip(this);
          bVar7 = CCoinsViewCache::Sync(pCVar13);
        }
        if (bVar7 == false) {
          pNVar6 = (this->m_chainman->m_options).notifications;
          limiting_lock.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p =
               (_Alloc_hider)
               ((long)&limiting_lock.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&limiting_lock,"Failed to write to coin database.","");
          pbVar2 = &limiting_lock.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged;
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            limiting_lock.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ = &local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)pbVar2,"Failed to write to coin database.","");
          }
          else {
            last_prune = 0xfd3ed3;
            uStack_2ac = 0;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
                       (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&last_prune);
          }
          (*pNVar6->_vptr_Notifications[8])(pNVar6,&limiting_lock);
          if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &limiting_lock);
          }
          (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)limiting_lock.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_8_ != &local_1d8) goto LAB_00aeac55;
          goto LAB_00aeac65;
        }
        (this->m_last_flush).__d.__r = lVar16;
        bVar20 = 0;
      }
      else {
        pNVar6 = (this->m_chainman->m_options).notifications;
        limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&limiting_lock.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&limiting_lock,"Disk space is too low!","");
        pbVar2 = &limiting_lock.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          limiting_lock.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = &local_1d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pbVar2,"Disk space is too low!","");
        }
        else {
          last_prune = 0xfa0b16;
          uStack_2ac = 0;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&last_prune);
        }
        (*pNVar6->_vptr_Notifications[8])(pNVar6,&limiting_lock);
        if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &limiting_lock);
        }
        (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)limiting_lock.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._32_8_ != &local_1d8) {
LAB_00aeac55:
          operator_delete((void *)limiting_lock.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._32_8_,local_1d8._M_allocated_capacity + 1);
        }
LAB_00aeac65:
        if (limiting_lock.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p !=
            (pointer)((long)&limiting_lock.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10)) {
          operator_delete((void *)limiting_lock.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          limiting_lock.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        bVar20 = 1;
      }
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      bVar21 = bVar20;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (bVar20 == 0 && bVar21 == 0) {
    this_01 = (this->m_chainman->m_options).signals;
    bVar7 = true;
    if (this_01 != (ValidationSignals *)0x0) {
      role = GetRole(this);
      CChain::GetLocator((CBlockLocator *)&logging_timer13,&this->m_chain);
      ValidationSignals::ChainStateFlushed(this_01,role,(CBlockLocator *)&logging_timer13);
      if (logging_timer13.m_start_t.
          super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
          ._M_payload !=
          (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
           )0x0) {
        operator_delete((void *)logging_timer13.m_start_t.
                                super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                ._M_payload,
                        (long)logging_timer13.m_prefix._M_dataplus._M_p -
                        (long)logging_timer13.m_start_t.
                              super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                              ._M_payload);
      }
    }
  }
  else {
    bVar7 = (bool)(bVar21 ^ 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&setFilesToPrune._M_t);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar7;
  }
LAB_00aeb42b:
  __stack_chk_fail();
}

Assistant:

bool Chainstate::FlushStateToDisk(
    BlockValidationState &state,
    FlushStateMode mode,
    int nManualPruneHeight)
{
    LOCK(cs_main);
    assert(this->CanFlushToDisk());
    std::set<int> setFilesToPrune;
    bool full_flush_completed = false;

    const size_t coins_count = CoinsTip().GetCacheSize();
    const size_t coins_mem_usage = CoinsTip().DynamicMemoryUsage();

    try {
    {
        bool fFlushForPrune = false;
        bool fDoFullFlush = false;

        CoinsCacheSizeState cache_state = GetCoinsCacheSizeState();
        LOCK(m_blockman.cs_LastBlockFile);
        if (m_blockman.IsPruneMode() && (m_blockman.m_check_for_pruning || nManualPruneHeight > 0) && m_chainman.m_blockman.m_blockfiles_indexed) {
            // make sure we don't prune above any of the prune locks bestblocks
            // pruning is height-based
            int last_prune{m_chain.Height()}; // last height we can prune
            std::optional<std::string> limiting_lock; // prune lock that actually was the limiting factor, only used for logging

            for (const auto& prune_lock : m_blockman.m_prune_locks) {
                if (prune_lock.second.height_first == std::numeric_limits<int>::max()) continue;
                // Remove the buffer and one additional block here to get actual height that is outside of the buffer
                const int lock_height{prune_lock.second.height_first - PRUNE_LOCK_BUFFER - 1};
                last_prune = std::max(1, std::min(last_prune, lock_height));
                if (last_prune == lock_height) {
                    limiting_lock = prune_lock.first;
                }
            }

            if (limiting_lock) {
                LogDebug(BCLog::PRUNE, "%s limited pruning to height %d\n", limiting_lock.value(), last_prune);
            }

            if (nManualPruneHeight > 0) {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune (manual)", BCLog::BENCH);

                m_blockman.FindFilesToPruneManual(
                    setFilesToPrune,
                    std::min(last_prune, nManualPruneHeight),
                    *this, m_chainman);
            } else {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune", BCLog::BENCH);

                m_blockman.FindFilesToPrune(setFilesToPrune, last_prune, *this, m_chainman);
                m_blockman.m_check_for_pruning = false;
            }
            if (!setFilesToPrune.empty()) {
                fFlushForPrune = true;
                if (!m_blockman.m_have_pruned) {
                    m_blockman.m_block_tree_db->WriteFlag("prunedblockfiles", true);
                    m_blockman.m_have_pruned = true;
                }
            }
        }
        const auto nNow{SteadyClock::now()};
        // Avoid writing/flushing immediately after startup.
        if (m_last_write == decltype(m_last_write){}) {
            m_last_write = nNow;
        }
        if (m_last_flush == decltype(m_last_flush){}) {
            m_last_flush = nNow;
        }
        // The cache is large and we're within 10% and 10 MiB of the limit, but we have time now (not in the middle of a block processing).
        bool fCacheLarge = mode == FlushStateMode::PERIODIC && cache_state >= CoinsCacheSizeState::LARGE;
        // The cache is over the limit, we have to write now.
        bool fCacheCritical = mode == FlushStateMode::IF_NEEDED && cache_state >= CoinsCacheSizeState::CRITICAL;
        // It's been a while since we wrote the block index to disk. Do this frequently, so we don't need to redownload after a crash.
        bool fPeriodicWrite = mode == FlushStateMode::PERIODIC && nNow > m_last_write + DATABASE_WRITE_INTERVAL;
        // It's been very long since we flushed the cache. Do this infrequently, to optimize cache usage.
        bool fPeriodicFlush = mode == FlushStateMode::PERIODIC && nNow > m_last_flush + DATABASE_FLUSH_INTERVAL;
        // Combine all conditions that result in a full cache flush.
        fDoFullFlush = (mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical || fPeriodicFlush || fFlushForPrune;
        // Write blocks and block index to disk.
        if (fDoFullFlush || fPeriodicWrite) {
            // Ensure we can write block index
            if (!CheckDiskSpace(m_blockman.m_opts.blocks_dir)) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block and undo data to disk", BCLog::BENCH);

                // First make sure all block and undo data is flushed to disk.
                // TODO: Handle return error, or add detailed comment why it is
                // safe to not return an error upon failure.
                if (!m_blockman.FlushChainstateBlockFile(m_chain.Height())) {
                    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "%s: Failed to flush block file.\n", __func__);
                }
            }

            // Then update all block file information (which may refer to block and undo files).
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block index to disk", BCLog::BENCH);

                if (!m_blockman.WriteBlockIndexDB()) {
                    return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to block index database."));
                }
            }
            // Finally remove any pruned files
            if (fFlushForPrune) {
                LOG_TIME_MILLIS_WITH_CATEGORY("unlink pruned files", BCLog::BENCH);

                m_blockman.UnlinkPrunedFiles(setFilesToPrune);
            }
            m_last_write = nNow;
        }
        // Flush best chain related state. This can only be done if the blocks / block index write was also done.
        if (fDoFullFlush && !CoinsTip().GetBestBlock().IsNull()) {
            LOG_TIME_MILLIS_WITH_CATEGORY(strprintf("write coins cache to disk (%d coins, %.2fkB)",
                coins_count, coins_mem_usage / 1000), BCLog::BENCH);

            // Typical Coin structures on disk are around 48 bytes in size.
            // Pushing a new one to the database can cause it to be written
            // twice (once in the log, and once in the tables). This is already
            // an overestimation, as most will delete an existing entry or
            // overwrite one. Still, use a conservative safety factor of 2.
            if (!CheckDiskSpace(m_chainman.m_options.datadir, 48 * 2 * 2 * CoinsTip().GetCacheSize())) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            // Flush the chainstate (which may refer to block index entries).
            const auto empty_cache{(mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical};
            if (empty_cache ? !CoinsTip().Flush() : !CoinsTip().Sync()) {
                return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to coin database."));
            }
            m_last_flush = nNow;
            full_flush_completed = true;
            TRACE5(utxocache, flush,
                   int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - nNow)},
                   (uint32_t)mode,
                   (uint64_t)coins_count,
                   (uint64_t)coins_mem_usage,
                   (bool)fFlushForPrune);
        }
    }
    if (full_flush_completed && m_chainman.m_options.signals) {
        // Update best block in wallet (so we can detect restored wallets).
        m_chainman.m_options.signals->ChainStateFlushed(this->GetRole(), m_chain.GetLocator());
    }
    } catch (const std::runtime_error& e) {
        return FatalError(m_chainman.GetNotifications(), state, strprintf(_("System error while flushing: %s"), e.what()));
    }
    return true;
}